

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O0

int source_callback(void *data,int len,void *user)

{
  int local_38;
  int local_34;
  int j;
  int i;
  char *buffer;
  source_data *env;
  void *user_local;
  int len_local;
  void *data_local;
  
  for (local_34 = 0; local_34 < len; local_34 = local_34 + 1) {
    if (*(int *)((long)user + 0x18) < 1) {
      if (*(char *)((long)data + (long)local_34) == **(char **)((long)user + 8)) {
        *(undefined4 *)((long)user + 0x18) = 1;
      }
      else {
        fputc((int)*(char *)((long)data + (long)local_34),*user);
      }
    }
    else if (*(char *)((long)data + (long)local_34) ==
             *(char *)(*(long *)((long)user + 8) + (long)*(int *)((long)user + 0x18))) {
      *(int *)((long)user + 0x18) = *(int *)((long)user + 0x18) + 1;
    }
    else if (*(char *)(*(long *)((long)user + 8) + (long)*(int *)((long)user + 0x18)) == '\0') {
      *(undefined4 *)((long)user + 0x18) = 0;
      fprintf(*user,"%s",*(undefined8 *)((long)user + 0x10));
      fputc((int)*(char *)((long)data + (long)local_34),*user);
    }
    else {
      for (local_38 = 0; local_38 < *(int *)((long)user + 0x18); local_38 = local_38 + 1) {
        fputc((int)*(char *)(*(long *)((long)user + 8) + (long)local_38),*user);
      }
      *(undefined4 *)((long)user + 0x18) = 0;
      fputc((int)*(char *)((long)data + (long)local_34),*user);
    }
  }
  return 1;
}

Assistant:

int source_callback(const void* data, int len, void *user)
{
    source_data* env = (source_data*) user;
    const char* buffer = (const char*) data;
    int i = 0;

    // Copy the buffer to output and look for placeholder, replace it with data
    while (i < len)
    {
        // We are already recognizing placeholder
        if (env->state > 0) {
            if (buffer[i] == env->placeholder[env->state])
            {
                env->state++;
            } else {
                if (env->placeholder[env->state] == 0) // Placeholder recognized, insert data
                {

                    env->state = 0;

                    fprintf(env->out, "%s", env->identifier);
                    fputc(buffer[i], env->out);
                } else { // Not a placeholder, abort
                    int j;

                    for (j = 0; j < env->state; j++)
                        fputc(env->placeholder[j], env->out);

                    env->state = 0;

                    fputc(buffer[i], env->out);
                }

            }
        } else {
            if (buffer[i] == env->placeholder[0]) // Enter placeholder seek mode, pause output
            {
                env->state = 1;
            } else { // Output normally
                fputc(buffer[i], env->out);
            }
        }
        i++;
    }

    return 1;
}